

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

Node * GetNodeByAnchor(TidyDocImpl *doc,ctmbstr name)

{
  int iVar1;
  ctmbstr local_40;
  tmbstr lname;
  Anchor *pAStack_30;
  uint h;
  Anchor *found;
  TidyAttribImpl *attribs;
  ctmbstr name_local;
  TidyDocImpl *doc_local;
  
  local_40 = prvTidytmbstrdup(doc->allocator,name);
  iVar1 = prvTidyHTMLVersion(doc);
  if (iVar1 == 0x20000) {
    lname._4_4_ = anchorNameHash5(name);
  }
  else {
    lname._4_4_ = anchorNameHash(name);
    local_40 = prvTidytmbstrtolower(local_40);
  }
  pAStack_30 = (doc->attribs).anchor_hash[lname._4_4_];
  while ((pAStack_30 != (Anchor *)0x0 &&
         (iVar1 = prvTidytmbstrcmp(pAStack_30->name,local_40), iVar1 != 0))) {
    pAStack_30 = pAStack_30->next;
  }
  (*doc->allocator->vtbl->free)(doc->allocator,local_40);
  if (pAStack_30 == (Anchor *)0x0) {
    doc_local = (TidyDocImpl *)0x0;
  }
  else {
    doc_local = (TidyDocImpl *)pAStack_30->node;
  }
  return &doc_local->root;
}

Assistant:

static Node* GetNodeByAnchor( TidyDocImpl* doc, ctmbstr name )
{
    TidyAttribImpl* attribs = &doc->attribs;
    Anchor *found;
    uint h;
    tmbstr lname = TY_(tmbstrdup)(doc->allocator, name);
    if (TY_(HTMLVersion)(doc) == HT50) {
        h = anchorNameHash5(name);
    }
    else
    {
        h = anchorNameHash(name);
        lname = TY_(tmbstrtolower)(lname);
    }

    for ( found = attribs->anchor_hash[h]; found != NULL; found = found->next )
    {
        if ( TY_(tmbstrcmp)(found->name, lname) == 0 )
            break;
    }
    
    TidyDocFree(doc, lname);
    if ( found )
        return found->node;
    return NULL;
}